

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

int Potassco::xconvert(char *x,bool *out,char **errPos,int param_4)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  
  if ((x == (char *)0x0) || (*x == '\0')) {
    iVar1 = 0;
    goto LAB_0019ef15;
  }
  lVar3 = 1;
  bVar2 = true;
  if (*x == '1') goto LAB_0019ef06;
  if (*x == '0') {
LAB_0019ef04:
    bVar2 = false;
LAB_0019ef06:
    *out = bVar2;
    x = x + lVar3;
  }
  else {
    lVar3 = 2;
    iVar1 = strncmp(x,"no",2);
    if (iVar1 == 0) goto LAB_0019ef04;
    lVar3 = 2;
    iVar1 = strncmp(x,"on",2);
    if (iVar1 == 0) goto LAB_0019ef06;
    lVar3 = 3;
    iVar1 = strncmp(x,"yes",3);
    if (iVar1 == 0) goto LAB_0019ef06;
    lVar3 = 3;
    iVar1 = strncmp(x,"off",3);
    if (iVar1 == 0) goto LAB_0019ef04;
    lVar3 = 4;
    iVar1 = strncmp(x,"true",4);
    if (iVar1 == 0) goto LAB_0019ef06;
    lVar3 = 5;
    iVar1 = strncmp(x,"false",5);
    if (iVar1 == 0) goto LAB_0019ef04;
  }
  iVar1 = 1;
LAB_0019ef15:
  if (errPos != (char **)0x0) {
    *errPos = x;
  }
  return iVar1;
}

Assistant:

int xconvert(const char* x, bool& out, const char** errPos, int) {
	if      (empty(x, errPos))           { return 0; }
	else if (*x == '1')                  { out = true;  x += 1; }
	else if (*x == '0')                  { out = false; x += 1; }
	else if (strncmp(x, "no", 2)  == 0)  { out = false; x += 2; }
	else if (strncmp(x, "on", 2)  == 0)  { out = true;  x += 2; }
	else if (strncmp(x, "yes", 3) == 0)  { out = true;  x += 3; }
	else if (strncmp(x, "off", 3) == 0)  { out = false; x += 3; }
	else if (strncmp(x, "true", 4) == 0) { out = true;  x += 4; }
	else if (strncmp(x, "false", 5) == 0){ out = false; x += 5; }
	return parsed(1, x, errPos);
}